

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O3

bool pstore::http::
     check_message_complete<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
               (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                *sender,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                        io,frame *wsp,opcode *op,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *payload)

{
  pointer puVar1;
  long lVar2;
  undefined8 *puVar3;
  bool bVar4;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> io_00;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  undefined8 *puVar5;
  opcode oVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar7;
  span<const_unsigned_char,__1L> *in_R9;
  long *in_FS_OFFSET;
  error_code eVar8;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  eo3;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_90;
  long *local_78 [2];
  long local_68 [2];
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_58;
  extent_type<_1L> local_40;
  pointer local_38;
  
  if (wsp->fin == true) {
    oVar6 = *op;
    if (oVar6 == text) {
      pvVar7 = payload;
      bVar4 = is_valid_utf8<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )(payload->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start,
                         (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )(payload->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish);
      if (!bVar4) {
        send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                  (&local_58,(http *)sender,
                   (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                    *)io._M_data,
                   (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                    )0x3ef,(close_status_code)pvVar7);
        if (local_58.has_error_ == false) {
          error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          ::
          value_storage_impl<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>&,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                    (&local_58);
        }
        else {
          error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          ::
          error_storage_impl<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>&,std::error_code>
                    (&local_58);
        }
        return false;
      }
      oVar6 = *op;
    }
    puVar1 = (payload->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pstore::gsl::details::extent_type<-1L>::extent_type
              (&local_40,
               (long)(payload->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
    pstore::gsl::details::extent_type<-1L>::extent_type(&local_40,local_40.size_);
    io_00._M_data._4_4_ = 0;
    io_00._M_data._0_4_ = oVar6;
    local_38 = puVar1;
    send_message<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              (&local_90,(http *)sender,
               (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                *)io._M_data,io_00,(opcode)&local_40,in_R9);
    if (local_90.has_error_ == true) {
      eVar8 = error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
              ::get_error(&local_90);
      (**(code **)(*(long *)eVar8._M_cat + 0x20))(local_78,eVar8._M_cat,eVar8._M_value);
      pstore::details::log_destinations::__tls_init();
      lVar2 = *in_FS_OFFSET;
      if (*(long *)(lVar2 + -8) != 0) {
        pstore::details::log_destinations::__tls_init();
        puVar5 = *(undefined8 **)(lVar2 + -8);
        puVar3 = (undefined8 *)puVar5[1];
        for (puVar5 = (undefined8 *)*puVar5; puVar5 != puVar3; puVar5 = puVar5 + 1) {
          (**(code **)(*(long *)*puVar5 + 0x50))((long *)*puVar5,3,"Send error: ",local_78[0]);
        }
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
    }
    puVar1 = (payload->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((payload->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (payload->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    *op = unknown;
    if (local_90.has_error_ == false) {
      error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
      ::
      value_storage_impl<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>&,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                (&local_90);
    }
    else {
      error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
      ::
      error_storage_impl<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>&,std::error_code>
                (&local_90);
    }
  }
  return true;
}

Assistant:

bool check_message_complete (Sender const sender, IO const io, frame const & wsp,
                                     opcode & op, std::vector<std::uint8_t> & payload) {
            if (wsp.fin) {
                // We've got the complete message. If this was a text message, we need to
                // validate the UTF-8 that it contains.
                //
                // "When an endpoint is to interpret a byte stream as UTF-8 but finds that
                // the byte stream is not, in fact, a valid UTF-8 stream, that endpoint MUST
                // _Fail the WebSocket Connection_.
                if (op == opcode::text &&
                    !is_valid_utf8 (std::begin (payload), std::end (payload))) {

                    send_close_frame (sender, io, close_status_code::invalid_payload);
                    return false;
                }

                if (log_received_messages) {
                    std::string str;
                    std::transform (std::begin (payload), std::end (payload),
                                    std::back_inserter (str),
                                    [] (std::uint8_t const v) { return static_cast<char> (v); });
                    log (logger::priority::info, "Received: ", str);
                }

                // This implements a simple echo server ATM.
                error_or<IO> const eo3 = send_message (sender, io, op, gsl::make_span (payload));
                if (!eo3) {
                    log (logger::priority::error, "Send error: ", eo3.get_error ().message ());
                }

                payload.clear ();
                op = opcode::unknown;
            }
            return true;
        }